

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::initStyleOption(QComboBox *this,QStyleOptionComboBox *option)

{
  byte *pbVar1;
  State *pSVar2;
  QModelIndex *index;
  undefined1 *puVar3;
  QAbstractItemModel *pQVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  char cVar8;
  Int IVar9;
  QSize QVar10;
  long in_FS_OFFSET;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (option != (QStyleOptionComboBox *)0x0) {
    index = *(QModelIndex **)&(this->super_QWidget).field_0x8;
    QStyleOption::initFrom((QStyleOption *)option,&this->super_QWidget);
    option->editable = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0) != 0;
    option->frame = (bool)((byte)index[0x23].c >> 2 & 1);
    bVar7 = QWidget::hasFocus(&this->super_QWidget);
    if ((bVar7) && (option->editable == false)) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOptionComplex).super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    (option->super_QStyleOptionComplex).subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>
    .super_QFlagsStorage<QStyle::SubControl>.i = 0xffffffff;
    if (*(int *)&index[0x21].m.ptr == 4) {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i = 4
      ;
      pSVar2 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      (pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
           super_QFlagsStorage<QStyle::StateFlag>.i | *(uint *)&index[0x21].m.ptr;
    }
    else {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
           *(Int *)((long)&index[0x21].m.ptr + 4);
    }
    currentText((QString *)(local_70 + 0x18),this);
    pDVar5 = (option->currentText).d.d;
    pcVar6 = (option->currentText).d.ptr;
    (option->currentText).d.d = (Data *)local_58._0_8_;
    (option->currentText).d.ptr = (char16_t *)local_58._8_8_;
    puVar3 = (undefined1 *)(option->currentText).d.size;
    (option->currentText).d.size = (qsizetype)local_48;
    local_58._0_8_ = pDVar5;
    local_58._8_8_ = pcVar6;
    local_48 = puVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_70 + 0x18));
    cVar8 = QPersistentModelIndex::isValid();
    if (cVar8 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)(local_70 + 0x18),(QPersistentModelIndex *)(index + 0x1d));
      QComboBoxPrivate::itemIcon((QComboBoxPrivate *)local_70,index);
      QIcon::operator=(&option->currentIcon,(QIcon *)local_70);
      QIcon::~QIcon((QIcon *)local_70);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = index[0x1b].m.ptr;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)local_70,(QPersistentModelIndex *)(index + 0x1d));
      (**(code **)(*(long *)pQVar4 + 0x90))(local_70 + 0x18,pQVar4,(QModelIndex *)local_70,7);
      if ((undefined1 *)0x3 < puStack_40) {
        IVar9 = ::QVariant::toUInt((bool *)(local_70 + 0x18));
        (option->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar9;
      }
      ::QVariant::~QVariant((QVariant *)(local_70 + 0x18));
    }
    QVar10 = iconSize(this);
    option->iconSize = QVar10;
    bVar7 = QPointer::operator_cast_to_bool((QPointer *)&index[0x1c].i);
    if ((bVar7) && ((*(byte *)(*(long *)(index[0x1c].m.ptr + 0x20) + 9) & 0x80) != 0)) {
      pSVar2 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 0x20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::initStyleOption(QStyleOptionComboBox *option) const
{
    if (!option)
        return;

    Q_D(const QComboBox);
    option->initFrom(this);
    option->editable = isEditable();
    option->frame = d->frame;
    if (hasFocus() && !option->editable)
        option->state |= QStyle::State_Selected;
    option->subControls = QStyle::SC_All;
    if (d->arrowState == QStyle::State_Sunken) {
        option->activeSubControls = QStyle::SC_ComboBoxArrow;
        option->state |= d->arrowState;
    } else {
        option->activeSubControls = d->hoverControl;
    }
    option->currentText = currentText();
    if (d->currentIndex.isValid()) {
        option->currentIcon = d->itemIcon(d->currentIndex);
        QVariant alignment = d->model->data(d->currentIndex, Qt::TextAlignmentRole);
        if (alignment.isValid())
            option->textAlignment = static_cast<Qt::Alignment>(alignment.toUInt());
    }
    option->iconSize = iconSize();
    if (d->container && d->container->isVisible())
        option->state |= QStyle::State_On;
}